

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Directed_Energy_Fire_PDU *this)

{
  pointer pKVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KINT32 Value;
  pointer pKVar3;
  KStringStream ss;
  KString local_2d0;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Header7::GetAsString_abi_cxx11_(&local_2d0,&this->super_Header);
  poVar2 = std::operator<<(local_1a0,(string *)&local_2d0);
  poVar2 = std::operator<<(poVar2,"-Directed Energy Fire PDU-\n");
  poVar2 = std::operator<<(poVar2,"Firing Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f0,&this->m_FiringEntityID);
  UTILS::IndentString(&local_1d0,&local_1f0,Tabs,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"Event ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_230,&this->m_EventID);
  UTILS::IndentString(&local_210,&local_230,Tabs_00,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"Munition Type:              ");
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_250,&this->m_MunTyp);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"Shot Start Time:            ");
  DATA_TYPE::ClockTime::GetAsString_abi_cxx11_(&local_270,&this->m_ShotStartTime);
  poVar2 = std::operator<<(poVar2,(string *)&local_270);
  poVar2 = std::operator<<(poVar2,"Cumulative Shot Time:       ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)this->m_f32CumulativeShotTime);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Emitter Location:           ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_290,&this->m_EmitterLoc);
  poVar2 = std::operator<<(poVar2,(string *)&local_290);
  poVar2 = std::operator<<(poVar2,"Aperture Diameter:          ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)this->m_f32AperDiameter);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Wavelength:                 ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)this->m_f32Wavelength);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Peak Irradiance:            ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)this->m_f32PeakIrradiance);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Pulse Repetition Frequency: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)this->m_f32PulseRepFreq);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Pulse Width:                ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)this->m_f32PulseWidth);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Flags:\n");
  poVar2 = std::operator<<(poVar2,"\tWeapon State: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_DeUnion).m_ui16Flags & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tState Update: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_DeUnion).m_ui16Flags >> 1 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Pulse Shape:                ");
  DATA_TYPE::ENUMS::GetEnumAsStringBeamSpotShape_abi_cxx11_
            (&local_2b0,(ENUMS *)(ulong)this->m_ui8PulseShp,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_2b0);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of DE Records:       ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumDERecs);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"DE Records:\n");
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  pKVar1 = (this->m_vDeRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar3 = (this->m_vDeRec).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar3 != pKVar1; pKVar3 = pKVar3 + 1) {
    (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_2d0);
    std::operator<<(local_1a0,(string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

KString Directed_Energy_Fire_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Directed Energy Fire PDU-\n"
       << "Firing Entity ID:\n"
       << IndentString( m_FiringEntityID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 )
       << "Munition Type:              " << m_MunTyp.GetAsString()
       << "Shot Start Time:            " << m_ShotStartTime.GetAsString()
       << "Cumulative Shot Time:       " << m_f32CumulativeShotTime                       << "\n"
       << "Emitter Location:           " << m_EmitterLoc.GetAsString()
       << "Aperture Diameter:          " << m_f32AperDiameter                             << "\n"
       << "Wavelength:                 " << m_f32Wavelength                               << "\n"
       << "Peak Irradiance:            " << m_f32PeakIrradiance                           << "\n"
       << "Pulse Repetition Frequency: " << m_f32PulseRepFreq                             << "\n"
       << "Pulse Width:                " << m_f32PulseWidth                               << "\n"
       << "Flags:\n"
       << "\tWeapon State: "             << m_DeUnion.m_ui16WeaponState                   << "\n"
       << "\tState Update: "             << m_DeUnion.m_ui16StateUpdate                   << "\n"
       << "Pulse Shape:                " << GetEnumAsStringBeamSpotShape( m_ui8PulseShp ) << "\n"
       << "Number Of DE Records:       " << m_ui16NumDERecs                               << "\n"
       << "DE Records:\n";

    vector<StdVarPtr>::const_iterator citr = m_vDeRec.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vDeRec.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}